

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_decode.c
# Opt level: O1

void buffer_decode_register_write(cpu_mapping *mapping,uint32_t start,uint32_t len)

{
  ib_decode_state *state;
  user_decode_state *state_00;
  uint8_t uVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  _Bool _Var8;
  int iVar9;
  uint64_t uVar10;
  gpu_object *pgVar11;
  gpu_object *pgVar12;
  gpu_mapping *pgVar13;
  ulong uVar14;
  fifo_state *pfVar15;
  long lVar16;
  ulong uVar17;
  char *__format;
  int iVar18;
  long lVar19;
  char comment [50];
  char pushbuf_desc [1024];
  char local_478 [64];
  char local_438 [1032];
  
  local_478[0] = '\0';
  local_438[0] = '\0';
  puVar6 = mapping->data;
  uVar17 = (ulong)start;
  uVar10 = cpu_mapping_to_gpu_addr(mapping,uVar17);
  lVar16 = uVar10 - uVar17;
  if (uVar10 == 0) {
    lVar16 = 0;
  }
  if (mapping->fdtype == FDNVIDIA) {
    pgVar11 = nvrm_get_device(mapping->object);
    iVar9 = nvrm_get_chipset(pgVar11);
    _Var8 = nvrm_get_pb_pointer_found(pgVar11);
    if (iVar9 < 0x80 && iVar9 != 0x50 || _Var8) {
      if ((start == 0x40 && !_Var8) && (uVar2 = *(uint *)(mapping->data + 0x40), (ulong)uVar2 != 0))
      {
        pgVar12 = nvrm_get_fifo(mapping->object,lVar16 + uVar17,1);
        if ((pgVar12 != (gpu_object *)0x0) &&
           (iVar9 = is_fifo_and_addr_belongs(pgVar12,lVar16 + uVar17), iVar9 != 0)) {
          nvrm_device_set_pb_pointer_found(pgVar11,true);
        }
        _Var8 = nvrm_get_pb_pointer_found(pgVar11);
        if ((!_Var8) &&
           (pgVar13 = gpu_mapping_find((ulong)uVar2,pgVar11), pgVar13 != (gpu_mapping *)0x0)) {
          nvrm_device_set_pb_pointer_found(pgVar11,true);
        }
        _Var8 = nvrm_get_pb_pointer_found(pgVar11);
        if (_Var8) {
          if (((info != 0) && (decode_pb != 0)) &&
             (fprintf(_stdout,"USER buffer: %d\n",(ulong)mapping->id), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
          (mapping->user).is = 1;
        }
      }
    }
    else if ((start & 4) != 0) {
      puVar7 = mapping->data;
      if (((*(uint *)(puVar7 + ((ulong)(start & 0xfffffffc) - 4)) != 0) &&
          ((*(uint *)(puVar7 + ((ulong)(start & 0xfffffffc) - 4)) & 3) == 0)) &&
         (uVar14 = (ulong)(start >> 2), *(int *)(puVar7 + uVar14 * 4) != 0)) {
        if (lVar16 != 0) {
          pgVar12 = nvrm_get_fifo(mapping->object,lVar16 + uVar17,1);
          if ((pgVar12 != (gpu_object *)0x0) &&
             (iVar9 = is_fifo_and_addr_belongs(pgVar12,lVar16 + uVar17), iVar9 != 0)) {
            nvrm_device_set_pb_pointer_found(pgVar11,true);
            pfVar15 = get_fifo_state(pgVar12);
            (mapping->ib).entries = (uint32_t)(pfVar15->ib).entries;
          }
        }
        _Var8 = nvrm_get_pb_pointer_found(pgVar11);
        if ((!_Var8) && (gpu_objects != (gpu_object *)0x0)) {
          uVar1 = puVar7[uVar14 * 4];
          uVar3 = *(undefined4 *)(puVar7 + uVar14 * 4 + -4);
          pgVar12 = gpu_objects;
          do {
            for (pgVar13 = pgVar12->gpu_mappings; pgVar13 != (gpu_mapping *)0x0;
                pgVar13 = pgVar13->next) {
              if ((pgVar13->address == (ulong)(CONCAT14(uVar1,uVar3) & 0xfffffffffc)) &&
                 ((ulong)(*(uint *)(puVar7 + uVar14 * 4) >> 8 & 0x7ffffc) <= pgVar13->length)) {
                nvrm_device_set_pb_pointer_found(pgVar11,true);
                break;
              }
            }
            _Var8 = nvrm_get_pb_pointer_found(pgVar11);
          } while ((!_Var8) && (pgVar12 = pgVar12->next, pgVar12 != (gpu_object *)0x0));
        }
        _Var8 = nvrm_get_pb_pointer_found(pgVar11);
        if (_Var8) {
          if (((info != 0) && (decode_pb != 0)) &&
             (fprintf(_stdout,"IB buffer: %d\n",(ulong)mapping->id), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
          (mapping->ib).is = 1;
          (mapping->ib).offset = start - 4;
        }
      }
    }
  }
  if ((mapping->ib).is == 0) {
    lVar19 = 0xf8;
    if ((mapping->user).is == 0) goto LAB_00245722;
  }
  else if ((start < (mapping->ib).offset) || (lVar19 = 0xa8, mapping->length <= uVar17))
  goto LAB_00245722;
  pgVar11 = nvrm_get_fifo(mapping->object,uVar17 + lVar16,0);
  *(gpu_object **)((long)&mapping->id + lVar19) = pgVar11;
LAB_00245722:
  uVar2 = len + start;
  if (start < uVar2) {
    state = &(mapping->ib).state;
    state_00 = &(mapping->user).state;
    do {
      if ((lVar16 != 0) && (print_gpu_addresses != 0)) {
        sprintf(local_478," (gpu=0x%08lx)",(ulong)start + lVar16);
      }
      if (len < 4) {
        if (len < 2) {
          iVar18 = -1;
          iVar9 = 1;
          if (dump_memory_writes != 0) {
            uVar17 = (ulong)mapping->id;
            uVar14 = (ulong)puVar6[start];
            __format = "w %d:0x%04x%s, 0x%02x\n";
            iVar9 = 1;
            iVar18 = -1;
            goto LAB_002459c0;
          }
        }
        else {
          iVar18 = -2;
          iVar9 = 2;
          if (dump_memory_writes != 0) {
            uVar17 = (ulong)mapping->id;
            uVar14 = (ulong)*(ushort *)(puVar6 + start);
            __format = "w %d:0x%04x%s, 0x%04x\n";
            iVar9 = 2;
            iVar18 = -2;
LAB_002459c0:
            fprintf(_stdout,__format,uVar17,(ulong)start,local_478,uVar14);
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
        }
      }
      else if (((((mapping->ib).is == 0) || (uVar4 = (mapping->ib).offset, start < uVar4)) ||
               (uVar17 = (ulong)start, mapping->length <= uVar17)) ||
              ((uVar5 = (mapping->ib).entries, uVar5 != 0 && (uVar4 + uVar5 * 8 <= start)))) {
        if ((mapping->user).is == 0) {
          iVar18 = -4;
          iVar9 = 4;
          if (dump_memory_writes != 0) {
            uVar17 = (ulong)mapping->id;
            uVar14 = (ulong)*(uint *)(puVar6 + start);
            __format = "w %d:0x%04x%s, 0x%08x\n";
            iVar9 = 4;
            iVar18 = -4;
            goto LAB_002459c0;
          }
        }
        else {
          user_decode(state_00,start,*(uint32_t *)(puVar6 + start),local_438);
          if ((dump_memory_writes != 0) &&
             (fprintf(_stdout,"w %d:0x%04x%s, 0x%08x  %s\n",(ulong)mapping->id,(ulong)start,
                      local_478,(ulong)*(uint *)(puVar6 + start),local_438), mmt_sync_fd != -1)) {
            fflush(_stdout);
          }
          user_decode_end(state_00);
          iVar18 = -4;
          iVar9 = 4;
        }
      }
      else {
        if ((start & 4) != 0) {
          ib_decode(state,*(uint32_t *)(puVar6 + (uVar17 - 4)),local_438);
          ib_decode(state,*(uint32_t *)(puVar6 + uVar17),local_438);
        }
        if ((dump_memory_writes != 0) &&
           (fprintf(_stdout,"w %d:0x%04x%s, 0x%08x  %s\n",(ulong)mapping->id,(ulong)start,local_478,
                    (ulong)*(uint *)(puVar6 + uVar17),local_438), mmt_sync_fd != -1)) {
          fflush(_stdout);
        }
        iVar18 = -4;
        iVar9 = 4;
        if ((start & 4) != 0) {
          ib_decode_end(state);
        }
      }
      start = start + iVar9;
      len = len + iVar18;
    } while (start < uVar2);
  }
  return;
}

Assistant:

void buffer_decode_register_write(struct cpu_mapping *mapping, uint32_t start, uint32_t len)
{
	char pushbuf_desc[1024];
	char comment[50];
	comment[0] = 0;
	pushbuf_desc[0] = 0;

	unsigned char *data = mapping->data;
	uint32_t addr = start;
	uint32_t left = len;

	uint64_t gpu_addr = cpu_mapping_to_gpu_addr(mapping, start);
	if (gpu_addr)
		gpu_addr -= start;

	if (mapping->fdtype == FDNVIDIA)
	{
		struct gpu_object *dev = nvrm_get_device(mapping->object);
		int chipset = nvrm_get_chipset(dev);
		bool ib_supported = chipset == 0x50 || chipset >= 0x80;
		bool pb_pointer_found = nvrm_get_pb_pointer_found(dev);

		if (ib_supported && !pb_pointer_found)
		{
			uint32_t idx = start / 4;
			uint32_t *data = (uint32_t *)mapping->data;
			if ((idx & 1) == 1 && data[idx - 1] && data[idx] && !(data[idx - 1] & 0x3))
			{
				if (gpu_addr)
				{
					struct gpu_object *fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 1);
					if (fifo && is_fifo_and_addr_belongs(fifo, gpu_addr + addr))
					{
						nvrm_device_set_pb_pointer_found(dev, true);
						mapping->ib.entries = get_fifo_state(fifo)->ib.entries;
					}
				}

				if (!nvrm_get_pb_pointer_found(dev))
				{
					uint64_t pb_gpu_addr = (((uint64_t)(data[idx] & 0xff)) << 32) | (data[idx - 1] & 0xfffffffc);
					struct gpu_object *obj;
					for (obj = gpu_objects; obj != NULL; obj = obj->next)
					{
						struct gpu_mapping *gpu_mapping;
						for (gpu_mapping = obj->gpu_mappings; gpu_mapping != NULL; gpu_mapping = gpu_mapping->next)
						{
							if (gpu_mapping->address == pb_gpu_addr &&
								gpu_mapping->length >=  4 * ((data[idx] & 0x7fffffff) >> 10))
							{
								nvrm_device_set_pb_pointer_found(dev, true);
								break;
							}
						}

						if (nvrm_get_pb_pointer_found(dev))
							break;
					}
				}

				if (nvrm_get_pb_pointer_found(dev))
				{
					if (info && decode_pb)
						mmt_printf("IB buffer: %d\n", mapping->id);

					mapping->ib.is = 1;
					mapping->ib.offset = start - 4;
				}
			}
		}
		else if (!pb_pointer_found)
		{
			if (start == 0x40)
			{
				uint32_t pb_gpu_addr = *(uint32_t *)&(mapping->data[0x40]);
				if (pb_gpu_addr)
				{
					struct gpu_object *fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 1);
					if (fifo && is_fifo_and_addr_belongs(fifo, gpu_addr + addr))
						nvrm_device_set_pb_pointer_found(dev, true);

					if (!nvrm_get_pb_pointer_found(dev))
					{
						struct gpu_mapping *gpu_mapping = gpu_mapping_find(pb_gpu_addr, dev);
						if (gpu_mapping)
							nvrm_device_set_pb_pointer_found(dev, true);
					}

					if (nvrm_get_pb_pointer_found(dev))
					{
						if (info && decode_pb)
							mmt_printf("USER buffer: %d\n", mapping->id);

						mapping->user.is = 1;
					}
				}
			}
		}
	}

	if (mapping->ib.is)
	{
		if (addr >= mapping->ib.offset && addr < mapping->length)
			mapping->ib.state.pstate.fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 0);
	}
	else if (mapping->user.is)
		mapping->user.state.pstate.fifo = nvrm_get_fifo(mapping->object, gpu_addr + addr, 0);

	while (addr < start + len)
	{
		if (print_gpu_addresses && gpu_addr)
			sprintf(comment, " (gpu=0x%08" PRIx64 ")", gpu_addr + addr);

		if (left >= 4)
		{
			if (mapping->ib.is &&
					addr >= mapping->ib.offset &&
					addr < mapping->length &&
					(!mapping->ib.entries || addr < mapping->ib.offset + 8 * mapping->ib.entries))
			{
				if ((addr & 4) == 4)
				{
					ib_decode(&mapping->ib.state, *(uint32_t *)(data + addr - 4), pushbuf_desc);
					ib_decode(&mapping->ib.state, *(uint32_t *)(data + addr), pushbuf_desc);
				}

				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x  %s\n", mapping->id, addr, comment, *(uint32_t *)(data + addr), pushbuf_desc);

				if ((addr & 4) == 4)
					ib_decode_end(&mapping->ib.state);
			}
			else if (mapping->user.is)
			{
				user_decode(&mapping->user.state, addr, *(uint32_t *)(data + addr), pushbuf_desc);

				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x  %s\n", mapping->id, addr, comment, *(uint32_t *)(data + addr), pushbuf_desc);

				user_decode_end(&mapping->user.state);
			}
			else
			{
				if (dump_memory_writes)
					mmt_printf("w %d:0x%04x%s, 0x%08x\n", mapping->id, addr, comment, *(uint32_t *)(data + addr));
			}

			addr += 4;
			left -= 4;
		}
		else if (left >= 2)
		{
			if (dump_memory_writes)
				mmt_printf("w %d:0x%04x%s, 0x%04x\n", mapping->id, addr, comment, *(uint16_t *)(data + addr));
			addr += 2;
			left -= 2;
		}
		else
		{
			if (dump_memory_writes)
				mmt_printf("w %d:0x%04x%s, 0x%02x\n", mapping->id, addr, comment, *(uint8_t *)(data + addr));
			++addr;
			--left;
		}
	}
}